

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

int __thiscall
soplex::SPxDevexPR<double>::selectLeaveSparse(SPxDevexPR<double> *this,double feastol)

{
  int n;
  double *pdVar1;
  double *pdVar2;
  char *pcVar3;
  int *piVar4;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar5;
  long extraout_RDX_01;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar6;
  int i;
  int idx;
  int bstI;
  double best;
  double *cpen;
  double *fTest;
  double x;
  uint local_3c;
  int local_34;
  double local_30;
  
  SPxSolverBase<double>::fTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  pdVar1 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2a8d39);
  pdVar2 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2a8d55);
  local_30 = 0.0;
  local_34 = -1;
  local_3c = IdxSet::size((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8));
  lVar5 = extraout_RDX;
  while (local_3c = local_3c - 1, -1 < (int)local_3c) {
    pcVar3 = IdxSet::index((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8),(char *)(ulong)local_3c,
                           (int)lVar5);
    n = (int)pcVar3;
    if (-in_XMM0_Qa <= pdVar1[n]) {
      IdxSet::remove((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8),(char *)(ulong)local_3c);
      piVar4 = DataArray<int>::operator[]((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x868),n);
      *piVar4 = 0;
      lVar5 = extraout_RDX_01;
    }
    else {
      dVar6 = devexpr::computePrice<double>(pdVar1[n],pdVar2[n],in_XMM0_Qa);
      lVar5 = extraout_RDX_00;
      if (local_30 < dVar6) {
        lVar5 = (long)n;
        *(double *)(in_RDI + 0x38) = pdVar2[lVar5];
        local_34 = n;
        local_30 = dVar6;
      }
    }
  }
  return local_34;
}

Assistant:

int SPxDevexPR<R>::selectLeaveSparse(R feastol)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   int bstI = -1;
   int idx = -1;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = fTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         if(x > best)
         {
            best = x;
            bstI = idx;
            last = cpen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         assert(this->thesolver->isInfeasible[idx] == this->VIOLATED
                || this->thesolver->isInfeasible[idx] == this->VIOLATED_AND_CHECKED);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   return bstI;
}